

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_world.cpp
# Opt level: O1

void __thiscall RandomizerWorld::load_hint_sources(RandomizerWorld *this)

{
  bool bVar1;
  reference json;
  HintSource *new_source;
  Json hint_sources_json;
  iterator __end1;
  iterator __begin1;
  HintSource *local_a0;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_98;
  _Any_data local_88;
  code *local_78;
  undefined8 uStack_70;
  iterator local_68;
  iterator local_48;
  
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78 = (code *)0x0;
  uStack_70 = 0;
  nlohmann::
  basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<unsigned_char_const(&)[52249]>
            ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_98,
             (uchar (*) [52249])
             "[\n    {\n        \"description\": \"Lithograph\",\n        \"smallTextbox\": true\n    },\n    {\n        \"description\": \"Oracle Stone\",\n        \"smallTextbox\": true\n    },\n    {\n        \"description\": \"Mercator fortune teller\",\n        \"textIds\": [\n            654\n        ]\n    },\n    {\n        \"description\": \"King Nole\'s Cave sign\",\n        \"textIds\": [\n            253\n        ]\n    },\n    {\n        \"description\": \"Foxy (next to Ryuma\'s mayor house)\",\n        \"entity\": {\n            \"mapId\": 611,\n            \"position\": {\n                \"x\": 47,\n                \"y\": 25,\n                \"z\": 3\n            },\n            \"orientation\": \"sw\"\n        },\n        \"nodeId\": \"ryuma\"\n    },\n    {\n        \"description\": \"Foxy (behind trees in Gumi)\",\n        \"entity\": {\n            \"mapId\": [ 602, 603 ],\n            \"position\": {\n                \"x\": 24,\n                \"y\": 35,\n                \"z\": 6\n            },\n            \"orientation\": \"sw\"\n        },\n        \"nodeId\": \"gumi\"\n    },\n    {\n        \"description\": \"Foxy (next to Mercator gates)\",\n        \"entity\": {\n            \"mapId\": 454,\n            \"position\": {\n                \"x\": 18,\n                \"y\": 46,\n                \"z\": 0\n            },\n            \"orientation\": \"se\"\n        },\n        \"nodeId\": \"route_gumi_ryuma\"\n    },\n    {\n        \"description\": \"Foxy (near basin behind Mercator)\",\n        \"entity\": {\n            \"mapId\": 636,\n            \"position\": {\n                \"x\": 18,\n                \"y\": 27,\n                \"z\": 1\n            },\n            \"orientation\": \"nw\"\n        },\n        \"nodeId\": \"mercator\"\n    },\n    {\n        \"description\": \"Foxy (near cabin on Verla Shore)\",\n        \"entity\": {\n            \"mapId\": 468,\n            \"position\": {\n                \"x\": 24,\n                \"y\": 45,\n                \"z\": 1\n            },\n            \"orientation\": \"se\"\n        },\n        \"nodeId\": \"verla_shore\"\n    },\n    {\n        \"description\": \"Foxy (outside Verla Mines entrance)\",\n        \"entity\": {\n            \"mapId\": 470,\n            \"position\": {\n..." /* TRUNCATED STRING LITERAL */
             ,(parser_callback_t *)&local_88,true,true);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::begin(&local_48,&local_98);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::end(&local_68,&local_98);
  while( true ) {
    bVar1 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator==<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&local_48,&local_68);
    if (bVar1) break;
    json = nlohmann::detail::
           iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ::operator*(&local_48);
    local_a0 = HintSource::from_json(json,&this->_nodes);
    std::vector<HintSource*,std::allocator<HintSource*>>::emplace_back<HintSource*&>
              ((vector<HintSource*,std::allocator<HintSource*>> *)&this->_hint_sources,&local_a0);
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++(&local_48);
  }
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_98);
  return;
}

Assistant:

void RandomizerWorld::load_hint_sources()
{
    Json hint_sources_json = Json::parse(HINT_SOURCES_JSON, nullptr, true, true);
    for(const Json& hint_source_json : hint_sources_json)
    {
        HintSource* new_source = HintSource::from_json(hint_source_json, _nodes);
        _hint_sources.emplace_back(new_source);
    }
}